

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtInternalEdgeUtility.cpp
# Opt level: O2

bool cbtClampNormal(cbtVector3 *edge,cbtVector3 *tri_normal_org,cbtVector3 *localContactNormalOnB,
                   cbtScalar correctedEdgeAngle,cbtVector3 *clampedLocalNormal)

{
  undefined1 auVar1 [16];
  cbtVector3 *pcVar2;
  cbtScalar cVar3;
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  cbtVector3 cVar10;
  cbtVector3 edgeCross;
  cbtVector3 tri_normal;
  float local_8c;
  cbtQuaternion local_88;
  cbtVector3 local_78;
  cbtVector3 local_68;
  cbtMatrix3x3 local_50;
  
  auVar9 = in_ZMM1._8_56_;
  local_68.m_floats._0_8_ = *(undefined8 *)tri_normal_org->m_floats;
  local_68.m_floats._8_8_ = *(undefined8 *)(tri_normal_org->m_floats + 2);
  auVar6 = ZEXT856((ulong)local_68.m_floats._8_8_);
  cVar10 = cbtVector3::cross(edge,&local_68);
  auVar7._0_8_ = cVar10.m_floats._8_8_;
  auVar7._8_56_ = auVar9;
  auVar4._0_8_ = cVar10.m_floats._0_8_;
  auVar4._8_56_ = auVar6;
  local_50.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
  pcVar2 = cbtVector3::normalize(local_50.m_el);
  local_78.m_floats._0_8_ = *(undefined8 *)pcVar2->m_floats;
  local_78.m_floats._8_8_ = *(undefined8 *)(pcVar2->m_floats + 2);
  cVar3 = cbtGetAngle(&local_78,&local_68,localContactNormalOnB);
  auVar6 = ZEXT856(0);
  if ((0.0 <= correctedEdgeAngle) || (correctedEdgeAngle <= cVar3)) {
    if (correctedEdgeAngle < 0.0) {
      return false;
    }
    if (cVar3 <= correctedEdgeAngle) {
      return false;
    }
  }
  local_8c = correctedEdgeAngle - cVar3;
  auVar9 = (undefined1  [56])0x0;
  cbtQuaternion::setRotation(&local_88,edge,&local_8c);
  cbtMatrix3x3::setRotation(&local_50,&local_88);
  cVar10 = operator*(&local_50,localContactNormalOnB);
  auVar8._0_8_ = cVar10.m_floats._8_8_;
  auVar8._8_56_ = auVar6;
  auVar5._0_8_ = cVar10.m_floats._0_8_;
  auVar5._8_56_ = auVar9;
  auVar1 = vmovlhps_avx(auVar5._0_16_,auVar8._0_16_);
  *(undefined1 (*) [16])clampedLocalNormal->m_floats = auVar1;
  return true;
}

Assistant:

bool cbtClampNormal(const cbtVector3& edge, const cbtVector3& tri_normal_org, const cbtVector3& localContactNormalOnB, cbtScalar correctedEdgeAngle, cbtVector3& clampedLocalNormal)
{
	cbtVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	cbtVector3 edgeCross = edge.cross(tri_normal).normalize();
	cbtScalar curAngle = cbtGetAngle(edgeCross, tri_normal, localContactNormalOnB);

	if (correctedEdgeAngle < 0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			cbtScalar diffAngle = correctedEdgeAngle - curAngle;
			cbtQuaternion rotation(edge, diffAngle);
			clampedLocalNormal = cbtMatrix3x3(rotation) * localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle >= 0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			cbtScalar diffAngle = correctedEdgeAngle - curAngle;
			cbtQuaternion rotation(edge, diffAngle);
			clampedLocalNormal = cbtMatrix3x3(rotation) * localContactNormalOnB;
			return true;
		}
	}
	return false;
}